

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Core.cpp
# Opt level: O0

int __thiscall RenX::Core::think(Core *this)

{
  bool bVar1;
  int iVar2;
  reference this_00;
  pointer pSVar3;
  const_iterator local_30;
  unique_ptr<RenX::Server,_std::default_delete<RenX::Server>_> *local_28;
  __normal_iterator<std::unique_ptr<RenX::Server,_std::default_delete<RenX::Server>_>_*,_std::vector<std::unique_ptr<RenX::Server,_std::default_delete<RenX::Server>_>,_std::allocator<std::unique_ptr<RenX::Server,_std::default_delete<RenX::Server>_>_>_>_>
  local_20;
  __normal_iterator<std::unique_ptr<RenX::Server,_std::default_delete<RenX::Server>_>_*,_std::vector<std::unique_ptr<RenX::Server,_std::default_delete<RenX::Server>_>,_std::allocator<std::unique_ptr<RenX::Server,_std::default_delete<RenX::Server>_>_>_>_>
  local_18;
  iterator itr;
  Core *this_local;
  
  itr._M_current = (unique_ptr<RenX::Server,_std::default_delete<RenX::Server>_> *)this;
  local_18._M_current =
       (unique_ptr<RenX::Server,_std::default_delete<RenX::Server>_> *)
       std::
       vector<std::unique_ptr<RenX::Server,_std::default_delete<RenX::Server>_>,_std::allocator<std::unique_ptr<RenX::Server,_std::default_delete<RenX::Server>_>_>_>
       ::begin(&this->m_servers);
  while( true ) {
    local_20._M_current =
         (unique_ptr<RenX::Server,_std::default_delete<RenX::Server>_> *)
         std::
         vector<std::unique_ptr<RenX::Server,_std::default_delete<RenX::Server>_>,_std::allocator<std::unique_ptr<RenX::Server,_std::default_delete<RenX::Server>_>_>_>
         ::end(&this->m_servers);
    bVar1 = __gnu_cxx::
            operator==<std::unique_ptr<RenX::Server,_std::default_delete<RenX::Server>_>_*,_std::vector<std::unique_ptr<RenX::Server,_std::default_delete<RenX::Server>_>,_std::allocator<std::unique_ptr<RenX::Server,_std::default_delete<RenX::Server>_>_>_>_>
                      (&local_18,&local_20);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    this_00 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<RenX::Server,_std::default_delete<RenX::Server>_>_*,_std::vector<std::unique_ptr<RenX::Server,_std::default_delete<RenX::Server>_>,_std::allocator<std::unique_ptr<RenX::Server,_std::default_delete<RenX::Server>_>_>_>_>
              ::operator*(&local_18);
    pSVar3 = std::unique_ptr<RenX::Server,_std::default_delete<RenX::Server>_>::operator->(this_00);
    iVar2 = (**(pSVar3->super_Thinker)._vptr_Thinker)();
    if (iVar2 == 0) {
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<RenX::Server,_std::default_delete<RenX::Server>_>_*,_std::vector<std::unique_ptr<RenX::Server,_std::default_delete<RenX::Server>_>,_std::allocator<std::unique_ptr<RenX::Server,_std::default_delete<RenX::Server>_>_>_>_>
      ::operator++(&local_18);
    }
    else {
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<RenX::Server,std::default_delete<RenX::Server>>const*,std::vector<std::unique_ptr<RenX::Server,std::default_delete<RenX::Server>>,std::allocator<std::unique_ptr<RenX::Server,std::default_delete<RenX::Server>>>>>
      ::__normal_iterator<std::unique_ptr<RenX::Server,std::default_delete<RenX::Server>>*>
                ((__normal_iterator<std::unique_ptr<RenX::Server,std::default_delete<RenX::Server>>const*,std::vector<std::unique_ptr<RenX::Server,std::default_delete<RenX::Server>>,std::allocator<std::unique_ptr<RenX::Server,std::default_delete<RenX::Server>>>>>
                  *)&local_30,&local_18);
      local_28 = (unique_ptr<RenX::Server,_std::default_delete<RenX::Server>_> *)
                 std::
                 vector<std::unique_ptr<RenX::Server,_std::default_delete<RenX::Server>_>,_std::allocator<std::unique_ptr<RenX::Server,_std::default_delete<RenX::Server>_>_>_>
                 ::erase(&this->m_servers,local_30);
      local_18._M_current = local_28;
    }
  }
  iVar2 = Jupiter::Plugin::think();
  return iVar2;
}

Assistant:

int RenX::Core::think() {
	for (auto itr = m_servers.begin(); itr != m_servers.end();) {
		if ((*itr)->think() != 0) {
			itr = m_servers.erase(itr);
			continue;
		}
		++itr;
	}

	return Jupiter::Plugin::think();
}